

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmConditionEvaluator.cxx
# Opt level: O3

cmValue __thiscall
cmConditionEvaluator::GetDefinitionIfUnquoted
          (cmConditionEvaluator *this,cmExpandedCommandArgument *argument)

{
  cmMakefile *pcVar1;
  bool bVar2;
  string *psVar3;
  cmValue cVar4;
  cmListFileContext *context;
  ostream *poVar5;
  cmake *this_00;
  PolicyID id;
  ostringstream e;
  string local_1c0;
  undefined1 local_1a0 [376];
  
  if ((this->Policy54Status < NEW) ||
     (bVar2 = cmExpandedCommandArgument::WasQuoted(argument), !bVar2)) {
    pcVar1 = this->Makefile;
    psVar3 = cmExpandedCommandArgument::GetValue_abi_cxx11_(argument);
    cVar4 = cmMakefile::GetDefinition(pcVar1,psVar3);
    if (cVar4.Value != (string *)0x0) {
      bVar2 = cmExpandedCommandArgument::WasQuoted(argument);
      if (!bVar2) {
        return (cmValue)cVar4.Value;
      }
      if (this->Policy54Status != WARN) {
        return (cmValue)cVar4.Value;
      }
      pcVar1 = this->Makefile;
      context = cmConstStack<cmListFileContext,_cmListFileBacktrace>::Top
                          (&(this->Backtrace).
                            super_cmConstStack<cmListFileContext,_cmListFileBacktrace>);
      bVar2 = cmMakefile::HasCMP0054AlreadyBeenReported(pcVar1,context);
      if (bVar2) {
        return (cmValue)cVar4.Value;
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0);
      cmPolicies::GetPolicyWarning_abi_cxx11_(&local_1c0,(cmPolicies *)&DAT_00000036,id);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_1a0,local_1c0._M_dataplus._M_p,local_1c0._M_string_length
                         );
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\nQuoted variables like \"",0x18);
      psVar3 = cmExpandedCommandArgument::GetValue_abi_cxx11_(argument);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar5,(psVar3->_M_dataplus)._M_p,psVar3->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar5,
                 "\" will no longer be dereferenced when the policy is set to NEW.  Since the policy is not set the OLD behavior will be used."
                 ,0x7b);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
        operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
      }
      this_00 = cmMakefile::GetCMakeInstance(this->Makefile);
      std::__cxx11::stringbuf::str();
      cmake::IssueMessage(this_00,AUTHOR_WARNING,&local_1c0,&this->Backtrace);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
        operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a0);
      std::ios_base::~ios_base((ios_base *)(local_1a0 + 0x70));
      return (cmValue)cVar4.Value;
    }
  }
  return (cmValue)(string *)0x0;
}

Assistant:

cmValue cmConditionEvaluator::GetDefinitionIfUnquoted(
  cmExpandedCommandArgument const& argument) const
{
  if ((this->Policy54Status != cmPolicies::WARN &&
       this->Policy54Status != cmPolicies::OLD) &&
      argument.WasQuoted()) {
    return nullptr;
  }

  cmValue def = this->Makefile.GetDefinition(argument.GetValue());

  if (def && argument.WasQuoted() &&
      this->Policy54Status == cmPolicies::WARN) {
    if (!this->Makefile.HasCMP0054AlreadyBeenReported(this->Backtrace.Top())) {
      std::ostringstream e;
      // clang-format off
      e << (cmPolicies::GetPolicyWarning(cmPolicies::CMP0054))
        << "\n"
           "Quoted variables like \"" << argument.GetValue() << "\" "
           "will no longer be dereferenced when the policy is set to NEW.  "
           "Since the policy is not set the OLD behavior will be used.";
      // clang-format on

      this->Makefile.GetCMakeInstance()->IssueMessage(
        MessageType::AUTHOR_WARNING, e.str(), this->Backtrace);
    }
  }

  return def;
}